

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O3

void Parser::MapBindIdentifierFromElement<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6>
               (ParseNodePtr elementNode,anon_class_24_3_c793ac44 handler)

{
  Symbol *this;
  code *pcVar1;
  OpCode OVar2;
  bool bVar3;
  ParseNodeBin *pPVar4;
  ParseNodeVar *pPVar5;
  undefined4 *puVar6;
  
  OVar2 = elementNode->nop;
  if (OVar2 == knopEllipsis) {
    pPVar4 = (ParseNodeBin *)ParseNode::AsParseNodeUni(elementNode);
  }
  else {
    if (OVar2 != knopAsg) goto LAB_00818b27;
    pPVar4 = ParseNode::AsParseNodeBin(elementNode);
  }
  elementNode = pPVar4->pnode1;
  OVar2 = elementNode->nop;
LAB_00818b27:
  if ((OVar2 & ~knopInt) == knopObjectPattern) {
    MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6>(elementNode,handler)
    ;
    return;
  }
  if ((byte)(OVar2 + ~knopList) < 3) {
    pPVar5 = ParseNode::AsParseNodeVar(elementNode);
    this = pPVar5->sym;
    *handler.sym = this;
    if (this->symbolType == STFormal) {
      bVar3 = Symbol::NeedsSlotAlloc(this,handler.this,*handler.funcInfo);
      if (bVar3) {
        Symbol::EnsureScopeSlot(*handler.sym,handler.this,*handler.funcInfo);
        return;
      }
    }
  }
  else if (OVar2 != knopEmpty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                       ,0x2dc,"(bindIdentNode->nop == knopEmpty)","Invalid bind identifier");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  return;
}

Assistant:

static void MapBindIdentifierFromElement(ParseNodePtr elementNode, THandler handler)
    {
        ParseNodePtr bindIdentNode = elementNode;
        if (bindIdentNode->nop == knopAsg)
        {
            bindIdentNode = bindIdentNode->AsParseNodeBin()->pnode1;
        }
        else if (bindIdentNode->nop == knopEllipsis)
        {
            bindIdentNode = bindIdentNode->AsParseNodeUni()->pnode1;
        }

        if (bindIdentNode->IsPattern())
        {
            MapBindIdentifier(bindIdentNode, handler);
        }
        else if (bindIdentNode->IsVarLetOrConst())
        {
            handler(bindIdentNode);
        }
        else
        {
            AssertMsg(bindIdentNode->nop == knopEmpty, "Invalid bind identifier");
        }
    }